

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkRenode(Abc_Ntk_t *pNtk,int nFaninMax,int nCubeMax,int nFlowIters,int nAreaIters,int fArea,
             int fUseBdds,int fUseSops,int fUseCnfs,int fUseMv,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtkNew;
  If_Par_t *pPars;
  If_Par_t Pars;
  int fArea_local;
  int nAreaIters_local;
  int nFlowIters_local;
  int nCubeMax_local;
  int nFaninMax_local;
  Abc_Ntk_t *pNtk_local;
  
  Pars.pReoMan._4_4_ = fArea;
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    printf("Performing renoding with choices.\n");
  }
  nDsdCounter = 0;
  memset((If_Par_t *)&pPars,0,0x150);
  Pars.nGateSize = -0x40800000;
  Pars.nNonDecLimit = 0x3ba3d70a;
  Pars.nAndDelay = 1;
  Pars.nAndArea = Pars.pReoMan._4_4_;
  Pars.fPreprocess = 0;
  Pars.fArea = 0;
  Pars.fFancy = 0;
  Pars.fDoAverage = fVerbose;
  Pars.fSkipCutFilter = 1;
  Pars.fAreaOnly = 1;
  Pars.fUseCnfs = 0;
  Pars.fUseMv = 0;
  Pars.FinalDelay = 0.0;
  Pars.FinalArea = 0.0;
  Pars.pLutLib = (If_LibLut_t *)0x0;
  Pars.fTruth = fUseBdds;
  Pars.fUsePerm = fUseSops;
  Pars.fUseBdds = fUseCnfs;
  Pars.fUseSops = fUseMv;
  if (fUseBdds == 0) {
    if (fUseSops == 0) {
      if (fUseCnfs == 0) {
        if (fUseMv == 0) {
          Pars.pTimesReq = (float *)Abc_NtkRenodeEvalAig;
        }
        else {
          Pars.pTimesReq = (float *)Abc_NtkRenodeEvalMv;
        }
      }
      else {
        Pars.nAndArea = 1;
        Pars.pTimesReq = (float *)Abc_NtkRenodeEvalCnf;
      }
    }
    else {
      Pars.pTimesReq = (float *)Abc_NtkRenodeEvalSop;
    }
  }
  else {
    Pars.pTimesReq = (float *)Abc_NtkRenodeEvalBdd;
  }
  pPars._0_4_ = nFaninMax;
  pPars._4_4_ = nCubeMax;
  Pars.nLutSize = nFlowIters;
  Pars.nCutsMax = nAreaIters;
  if (fUseBdds == 0) {
    if (s_vMemory != (Vec_Int_t *)0x0) {
      __assert_fail("s_vMemory == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,0x81,
                    "Abc_Ntk_t *Abc_NtkRenode(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    s_vMemory = Vec_IntAlloc(0x10000);
    s_vMemory2 = Vec_IntAlloc(0x10000);
  }
  else {
    if (s_pReo != (reo_man *)0x0) {
      __assert_fail("s_pReo == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,0x7a,
                    "Abc_Ntk_t *Abc_NtkRenode(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    s_pDd = Cudd_Init(nFaninMax,0,0x100,0x40000,0);
    s_pReo = Extra_ReorderInit(nFaninMax,100);
    Pars.pFuncWrite = (_func_int_If_Man_t_ptr *)s_pReo;
  }
  pAVar2 = Abc_NtkIf(pNtk,(If_Par_t *)&pPars);
  if (fUseBdds == 0) {
    Vec_IntFree(s_vMemory);
    Vec_IntFree(s_vMemory2);
    s_vMemory = (Vec_Int_t *)0x0;
    s_vMemory2 = (Vec_Int_t *)0x0;
  }
  else {
    Extra_StopManager(s_pDd);
    Extra_ReorderQuit(s_pReo);
    s_pReo = (reo_man *)0x0;
    s_pDd = (DdManager *)0x0;
  }
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_NtkRenode( Abc_Ntk_t * pNtk, int nFaninMax, int nCubeMax, int nFlowIters, int nAreaIters, int fArea, int fUseBdds, int fUseSops, int fUseCnfs, int fUseMv, int fVerbose )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;

    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing renoding with choices.\n" );

    nDsdCounter = 0;

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  nFaninMax;
    pPars->nCutsMax    =  nCubeMax;
    pPars->nFlowIters  =  nFlowIters;
    pPars->nAreaIters  =  nAreaIters;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  1;
    pPars->fArea       =  fArea;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  0; //
    pPars->fLatchPaths =  0;
    pPars->fVerbose    =  fVerbose;
    // internal parameters
    pPars->fTruth      =  1;
    pPars->fUsePerm    =  1; 
    pPars->nLatchesCi  =  0;
    pPars->nLatchesCo  =  0;
    pPars->pLutLib     =  NULL; // Abc_FrameReadLibLut();
    pPars->pTimesArr   =  NULL; 
    pPars->pTimesArr   =  NULL;   
    pPars->fUseBdds    =  fUseBdds;
    pPars->fUseSops    =  fUseSops;
    pPars->fUseCnfs    =  fUseCnfs;
    pPars->fUseMv      =  fUseMv;
    if ( fUseBdds )
        pPars->pFuncCost = Abc_NtkRenodeEvalBdd;
    else if ( fUseSops )
        pPars->pFuncCost = Abc_NtkRenodeEvalSop;
    else if ( fUseCnfs )
    {
        pPars->fArea = 1;
        pPars->pFuncCost = Abc_NtkRenodeEvalCnf;
    }
    else if ( fUseMv )
        pPars->pFuncCost = Abc_NtkRenodeEvalMv;
    else
        pPars->pFuncCost = Abc_NtkRenodeEvalAig;

    // start the manager
    if ( fUseBdds )
    {
        assert( s_pReo == NULL );
        s_pDd  = Cudd_Init( nFaninMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        s_pReo = Extra_ReorderInit( nFaninMax, 100 );
        pPars->pReoMan  = s_pReo;
    }
    else
    {
        assert( s_vMemory == NULL );
        s_vMemory  = Vec_IntAlloc( 1 << 16 );
        s_vMemory2 = Vec_IntAlloc( 1 << 16 );
    }

    // perform mapping/renoding
    pNtkNew = Abc_NtkIf( pNtk, pPars );

    // start the manager
    if ( fUseBdds )
    {
        Extra_StopManager( s_pDd );
        Extra_ReorderQuit( s_pReo );
        s_pReo = NULL;
        s_pDd  = NULL;
    }
    else
    {
        Vec_IntFree( s_vMemory );
        Vec_IntFree( s_vMemory2 );
        s_vMemory = NULL;
        s_vMemory2 = NULL;
    }

//    printf( "Decomposed %d functions.\n", nDsdCounter );

    return pNtkNew;
}